

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O0

Config * __thiscall QPDFJob::PagesConfig::endPages(PagesConfig *this)

{
  element_type *peVar1;
  allocator<char> local_39;
  string local_38;
  size_type local_18;
  size_type n_specs;
  PagesConfig *this_local;
  
  n_specs = (size_type)this;
  peVar1 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this->config->o);
  local_18 = std::vector<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>::size
                       (&peVar1->page_specs);
  if (local_18 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"--pages: no page specifications given",&local_39);
    usage(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  return this->config;
}

Assistant:

QPDFJob::Config*
QPDFJob::PagesConfig::endPages()
{
    auto n_specs = config->o.m->page_specs.size();
    if (n_specs == 0) {
        usage("--pages: no page specifications given");
    }
    return this->config;
}